

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_set.hpp
# Opt level: O2

PragmaFunction * __thiscall
duckdb::FunctionSet<duckdb::PragmaFunction>::GetFunctionByOffset
          (PragmaFunction *__return_storage_ptr__,FunctionSet<duckdb::PragmaFunction> *this,
          idx_t offset)

{
  reference pvVar1;
  
  pvVar1 = vector<duckdb::PragmaFunction,_true>::get<true>(&this->functions,offset);
  PragmaFunction::PragmaFunction(__return_storage_ptr__,pvVar1);
  return __return_storage_ptr__;
}

Assistant:

T GetFunctionByOffset(idx_t offset) {
		D_ASSERT(offset < functions.size());
		return functions[offset];
	}